

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O2

MMDB_entry_data_list_s * test_uint64_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x12a,(pMVar1->entry_data).type,"==",9,"\'uint64\' key\'s value is an uint64",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x12d,(pMVar1->entry_data).field_1.int32,"==",0,"uint64 field is 2**60",0);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_uint64_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT64,
           "'uint64' key's value is an uint64");
    uint64_t expect = 1;
    expect <<= 60;
    cmp_ok(value->entry_data.uint64, "==", expect, "uint64 field is 2**60");

    return entry_data_list;
}